

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

Box2i __thiscall
Imf_3_4::DeepTiledInputFile::dataWindowForTile(DeepTiledInputFile *this,int dx,int dy,int lx,int ly)

{
  bool bVar1;
  int iVar2;
  ArgExc *pAVar3;
  int iVar4;
  undefined4 in_register_00000034;
  DeepTiledInputFile *this_00;
  int in_R9D;
  Box2i BVar5;
  int32_t tileSizeY;
  int32_t tileSizeX;
  Box2i dw;
  int local_1c0;
  int local_1bc;
  DeepTiledInputFile local_1b8 [12];
  
  this_00 = (DeepTiledInputFile *)CONCAT44(in_register_00000034,dx);
  bVar1 = isValidTile(this_00,dy,lx,ly,in_R9D);
  if (!bVar1) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar3,"Arguments not in valid range.");
    __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  dataWindowForLevel(local_1b8,dx,ly);
  iVar2 = exr_get_tile_sizes(*(this_00->_ctxt)._ctxt.
                              super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,((this_00->_data).
                                      super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->partNumber,ly,in_R9D,&local_1bc,&local_1c0);
  if (iVar2 == 0) {
    local_1b8[0]._ctxt._ctxt.super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._0_4_ = dy * local_1bc +
                   (int)local_1b8[0]._ctxt._ctxt.
                        super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1b8[0]._ctxt._ctxt.super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._4_4_ = lx * local_1c0 +
                   local_1b8[0]._ctxt._ctxt.
                   super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                   _4_4_;
    iVar2 = local_1bc +
            (int)local_1b8[0]._ctxt._ctxt.
                 super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr + -1;
    iVar4 = local_1c0 +
            local_1b8[0]._ctxt._ctxt.
            super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ + -1;
    if ((int)local_1b8[0]._ctxt._ctxt.
             super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        < iVar2) {
      iVar2 = (int)local_1b8[0]._ctxt._ctxt.
                   super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
    }
    if (local_1b8[0]._ctxt._ctxt.
        super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ < iVar4) {
      iVar4 = local_1b8[0]._ctxt._ctxt.
              super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_;
    }
    *(int *)&(this->_ctxt)._ctxt.
             super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (int)local_1b8[0]._ctxt._ctxt.
              super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(int *)((long)&(this->_ctxt)._ctxt.
                    super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
            ) = local_1b8[0]._ctxt._ctxt.
                super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_;
    *(int *)&(this->_ctxt)._ctxt.
             super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = iVar2;
    *(int *)((long)&(this->_ctxt)._ctxt.
                    super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4) = iVar4;
    BVar5.max.x = (int)local_1b8[0]._ctxt._ctxt.
                       super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
    BVar5.min = (Vec2<int>)this;
    BVar5.max.y = 0;
    return BVar5;
  }
  pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar3,"Unable to query the data window.");
  __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

IMATH_NAMESPACE::Box2i
DeepTiledInputFile::dataWindowForTile (int dx, int dy, int lx, int ly) const
{
    try
    {
        if (!isValidTile (dx, dy, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Arguments not in valid range.");

        //exr_attr_box2i_t dw = _ctxt.dataWindow (_data->partNumber);
        auto dw = dataWindowForLevel (lx, ly);

        int32_t tileSizeX, tileSizeY;
        if (EXR_ERR_SUCCESS !=
            exr_get_tile_sizes (_ctxt, _data->partNumber, lx, ly, &tileSizeX, &tileSizeY))
          throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

        dw.min.x += dx * tileSizeX;
        dw.min.y += dy * tileSizeY;
        int limX = dw.min.x + tileSizeX - 1;
        int limY = dw.min.y + tileSizeY - 1;
        limX = std::min (limX, dw.max.x);
        limY = std::min (limY, dw.max.y);

        return IMATH_NAMESPACE::Box2i (
            IMATH_NAMESPACE::V2i (dw.min.x, dw.min.y),
            IMATH_NAMESPACE::V2i (limX, limY));
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error calling dataWindowForTile() on image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}